

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnConstExpr
          (ExprVisitorDelegate *this,ConstExpr *expr)

{
  Enum EVar1;
  WatWriter *this_00;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  char buffer [128];
  char *local_98 [16];
  
  EVar1 = (expr->const_).type_.enum_;
  if (4 < (uint)(EVar1 + ~I8)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/wat-writer.cc"
                  ,0x1d9,"void wabt::(anonymous namespace)::WatWriter::WriteConst(const Const &)");
  }
  this_00 = this->writer_;
  switch(EVar1) {
  case V128:
    Opcode::GetInfo((Opcode *)&Opcode::V128Const_Opcode);
    WritePuts(this_00,local_98[0],Space);
    uVar2 = *(ulong *)(expr->const_).data_.v;
    uVar3 = *(ulong *)((expr->const_).data_.v + 8);
    Writef(this_00,"i32x4 0x%08x 0x%08x 0x%08x 0x%08x",uVar2,uVar2 >> 0x20,uVar3,uVar3 >> 0x20);
    break;
  case F64:
    Opcode::GetInfo((Opcode *)&Opcode::F64Const_Opcode);
    WritePuts(this_00,local_98[0],Space);
    WriteDoubleHex((char *)local_98,0x80,*(uint64_t *)(expr->const_).data_.v);
    WritePuts(this_00,(char *)local_98,Space);
    dVar4 = *(double *)(expr->const_).data_.v;
    goto LAB_001590e2;
  case F32:
    Opcode::GetInfo((Opcode *)&Opcode::F32Const_Opcode);
    WritePuts(this_00,local_98[0],Space);
    WriteFloatHex((char *)local_98,0x80,*(uint32_t *)(expr->const_).data_.v);
    WritePuts(this_00,(char *)local_98,Space);
    dVar4 = (double)*(float *)(expr->const_).data_.v;
LAB_001590e2:
    Writef(this_00,"(;=%g;)",dVar4);
    break;
  case I64:
    Opcode::GetInfo((Opcode *)&Opcode::I64Const_Opcode);
    WritePuts(this_00,local_98[0],Space);
    Writef(this_00,"%ld",*(undefined8 *)(expr->const_).data_.v);
    break;
  case I32:
    Opcode::GetInfo((Opcode *)&Opcode::I32Const_Opcode);
    WritePuts(this_00,local_98[0],Space);
    Writef(this_00,"%d",(ulong)*(uint *)(expr->const_).data_.v);
  }
  if (this_00->next_char_ == ForceNewline) {
    WriteNextChar(this_00);
  }
  this_00->next_char_ = Newline;
  return (Result)Ok;
}

Assistant:

WatWriter(Stream* stream, const WriteWatOptions& options,
            const Module &module)
      : ModuleContext(module), options_(options), stream_(stream) {}